

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.cpp
# Opt level: O1

string * normalize_char_name(string *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  const_iterator cVar6;
  ulong uVar7;
  string *__range2;
  
  uVar2 = s->_M_string_length;
  if (uVar2 < 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (s->_M_dataplus)._M_p;
    paVar1 = &s->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar4 = *(undefined8 *)((long)&s->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = uVar2;
    (s->_M_dataplus)._M_p = (pointer)paVar1;
    s->_M_string_length = 0;
    (s->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar3 = (s->_M_dataplus)._M_p;
    uVar7 = 0;
    do {
      iVar5 = tolower((int)pcVar3[uVar7]);
      pcVar3[uVar7] = (char)iVar5;
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
            ::find(&charnames_abi_cxx11_._M_t,s);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((_Rb_tree_header *)cVar6._M_node == &charnames_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
       ) {
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      pcVar3 = (s->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + s->_M_string_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string normalize_char_name(std::string s)
{
    if(s.length() > 1)
    {
        for(char &c : s)
            c = tolower(c);
        return charnames.count(s) ? s : "";
    }
    return s;
}